

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationSpeed.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationSpeed::Update
          (ChLinkMotorRotationSpeed *this,double mytime,bool update_assets)

{
  ChFrame<double> *Fb;
  double angle;
  undefined1 auVar1 [16];
  Scalar *pSVar2;
  ChConstraintTwoBodies *pCVar3;
  ChLinkMask *pCVar4;
  uint i;
  undefined1 auVar5 [16];
  Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_> local_4d0;
  undefined1 local_4b0 [56];
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true> local_478;
  ChFrame<double> aframe12rotating;
  ChMatrix33<double> Jw1;
  ChMatrix33<double> Jw2;
  ChMatrix33<double> abs_plane_rotating;
  ChFrame<double> aframe2rotating;
  ChFrame<double> aframe12;
  ChFrame<double> aframe2;
  ChFrame<double> aframe1;
  ChMatrix33<double> mtempQ;
  ChMatrix33<double> *local_78;
  double local_70;
  ChMatrix33<double> *pCStack_68;
  double local_60;
  double local_58;
  ulong local_50;
  ulong uStack_48;
  undefined8 local_40;
  double local_38;
  
  ChLinkMotorRotation::Update(&this->super_ChLinkMotorRotation,mytime,update_assets);
  Fb = (ChFrame<double> *)
       (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
       super_ChLink.Body1;
  if ((Fb != (ChFrame<double> *)0x0) &&
     ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
      super_ChLink.Body2 != (ChBodyFrame *)0x0)) {
    ChFrame<double>::operator>>
              (&aframe1,&(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric
                         .frame1,Fb);
    ChFrame<double>::operator>>
              (&aframe2,&(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric
                         .frame2,
               (ChFrame<double> *)
               (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.Body2);
    aframe2rotating._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
    aframe12rotating.coord.pos.m_data[1] = 0.0;
    aframe2rotating.coord.pos.m_data[2] = 0.0;
    aframe12rotating._vptr_ChFrame = (_func_int **)0x0;
    aframe12rotating.coord.pos.m_data[0] = 0.0;
    aframe2rotating.coord.pos.m_data[0] = 0.0;
    aframe2rotating.coord.pos.m_data[1] = 0.0;
    ChFrame<double>::ChFrame
              (&aframe12,(ChVector<double> *)&aframe12rotating,
               (ChQuaternion<double> *)&aframe2rotating);
    ChFrame<double>::TransformParentToLocal(&aframe2,&aframe1,&aframe12);
    aframe12rotating._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
    aframe12rotating.coord.pos.m_data[2] = 0.0;
    abs_plane_rotating.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    abs_plane_rotating.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    abs_plane_rotating.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    aframe12rotating.coord.pos.m_data[0] = 0.0;
    aframe12rotating.coord.pos.m_data[1] = 0.0;
    ChFrame<double>::ChFrame
              (&aframe2rotating,(ChVector<double> *)&abs_plane_rotating,
               (ChQuaternion<double> *)&aframe12rotating);
    if (this->avoid_angle_drift == true) {
      angle = this->aux_dt + *(double *)&(this->super_ChLinkMotorRotation).field_0x278;
    }
    else {
      ChQuaternion<double>::Q_to_Rotv((ChVector<double> *)&aframe12rotating,&aframe12.coord.rot);
      angle = aframe12rotating.coord.pos.m_data[1];
    }
    Q_from_AngAxis((ChQuaternion<double> *)&abs_plane_rotating,angle,(ChVector<double> *)&VECT_Z);
    ChQuaternion<double>::operator*
              ((ChQuaternion<double> *)&aframe12rotating,&aframe2.coord.rot,
               (ChQuaternion<double> *)&abs_plane_rotating);
    ChFrame<double>::SetRot(&aframe2rotating,(ChQuaternion<double> *)&aframe12rotating);
    abs_plane_rotating.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    abs_plane_rotating.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    Jw1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    Jw1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    Jw1.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    abs_plane_rotating.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    abs_plane_rotating.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    ChFrame<double>::ChFrame
              (&aframe12rotating,(ChVector<double> *)&Jw1,
               (ChQuaternion<double> *)&abs_plane_rotating);
    ChFrame<double>::TransformParentToLocal(&aframe2rotating,&aframe1,&aframe12rotating);
    abs_plane_rotating.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         aframe2rotating.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    abs_plane_rotating.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         aframe2rotating.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    abs_plane_rotating.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         aframe2rotating.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    abs_plane_rotating.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         aframe2rotating.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    abs_plane_rotating.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         aframe2rotating.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    abs_plane_rotating.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         aframe2rotating.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    abs_plane_rotating.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         aframe2rotating.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    abs_plane_rotating.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         aframe2rotating.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    abs_plane_rotating.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         aframe2rotating.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    Jw2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)&(((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                    super_ChLinkMate.super_ChLink.Body1)->super_ChFrameMoving<double>).
                  super_ChFrame<double>.Amatrix;
    Jw2.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&abs_plane_rotating;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jw1,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&Jw2);
    pCStack_68 = &(((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
                    super_ChLinkMate.super_ChLink.Body2)->super_ChFrameMoving<double>).
                  super_ChFrame<double>.Amatrix;
    local_78 = &abs_plane_rotating;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>const>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jw2,
               (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_78);
    auVar1._8_8_ = aframe12rotating.coord.rot.m_data[2];
    auVar1._0_8_ = aframe12rotating.coord.rot.m_data[1];
    local_60 = aframe12rotating.coord.rot.m_data[3] * 0.5;
    auVar5._8_8_ = 0x3fe0000000000000;
    auVar5._0_8_ = 0x3fe0000000000000;
    auVar5 = vmulpd_avx512vl(auVar1,auVar5);
    local_78 = (ChMatrix33<double> *)(aframe12rotating.coord.rot.m_data[0] * 0.5);
    local_70 = -local_60;
    local_50 = auVar5._0_8_ ^ 0x8000000000000000;
    pCStack_68 = auVar5._8_8_;
    uStack_48 = (ulong)pCStack_68 ^ 0x8000000000000000;
    local_40 = vmovlpd_avx(auVar5);
    local_4b0._0_8_ =
         (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
          *)&local_78;
    local_4b0._8_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jw1;
    local_58 = (double)local_78;
    local_38 = (double)local_78;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&mtempQ.super_Matrix<double,_3,_3,_1,_3,_3>,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                *)local_4b0);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Matrix<double,_3,_3,_1,_3,_3> *)&Jw1,&mtempQ.super_Matrix<double,_3,_3,_1,_3,_3>);
    local_4b0._0_8_ =
         (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
          *)&local_78;
    local_4b0._8_8_ = (PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Jw2;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (&mtempQ.super_Matrix<double,_3,_3,_1,_3,_3>,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                *)local_4b0);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Matrix<double,_3,_3,_1,_3,_3> *)&Jw2,&mtempQ.super_Matrix<double,_3,_3,_1,_3,_3>);
    i = (uint)(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_z +
        (uint)(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_y +
        (uint)(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_x;
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_rx == true) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_6,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>,_1> *)
                          &(this->super_ChLinkMotorRotation).super_ChLinkMotor.
                           super_ChLinkMateGeneric.C,(ulong)(i & 0xff));
      pCVar4 = &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask;
      *pSVar2 = aframe12rotating.coord.rot.m_data[1];
      pCVar3 = ChLinkMask::Constr_N(pCVar4,i);
      (*(pCVar3->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                ((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                  *)local_4b0,pCVar3);
      Eigen::
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>::
      setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
               *)local_4b0);
      pCVar3 = ChLinkMask::Constr_N(pCVar4,i);
      (*(pCVar3->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                ((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                  *)local_4b0,pCVar3);
      Eigen::
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>::
      setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
               *)local_4b0);
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_478,&Jw1.super_Matrix<double,_3,_3,_1,_3,_3>,0);
      pCVar3 = ChLinkMask::Constr_N(pCVar4,i);
      (*(pCVar3->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                (&local_4d0,pCVar3);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_4b0,&local_4d0,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_4b0,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_478)
      ;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_478,&Jw2.super_Matrix<double,_3,_3,_1,_3,_3>,0);
      pCVar3 = ChLinkMask::Constr_N(pCVar4,i);
      (*(pCVar3->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                (&local_4d0,pCVar3);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_4b0,&local_4d0,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_4b0,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_478)
      ;
      i = i + 1;
    }
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_ry == true) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_6,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>,_1> *)
                          &(this->super_ChLinkMotorRotation).super_ChLinkMotor.
                           super_ChLinkMateGeneric.C,(ulong)i);
      pCVar4 = &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask;
      *pSVar2 = aframe12rotating.coord.rot.m_data[2];
      pCVar3 = ChLinkMask::Constr_N(pCVar4,i);
      (*(pCVar3->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                ((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                  *)local_4b0,pCVar3);
      Eigen::
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>::
      setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
               *)local_4b0);
      pCVar3 = ChLinkMask::Constr_N(pCVar4,i);
      (*(pCVar3->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                ((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                  *)local_4b0,pCVar3);
      Eigen::
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>::
      setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
               *)local_4b0);
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_478,&Jw1.super_Matrix<double,_3,_3,_1,_3,_3>,1);
      pCVar3 = ChLinkMask::Constr_N(pCVar4,i);
      (*(pCVar3->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                (&local_4d0,pCVar3);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_4b0,&local_4d0,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_4b0,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_478)
      ;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_478,&Jw2.super_Matrix<double,_3,_3,_1,_3,_3>,1);
      pCVar3 = ChLinkMask::Constr_N(pCVar4,i);
      (*(pCVar3->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                (&local_4d0,pCVar3);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_4b0,&local_4d0,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_4b0,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_478)
      ;
      i = i + 1;
    }
    if ((this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.c_rz == true) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_6,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>,_1> *)
                          &(this->super_ChLinkMotorRotation).super_ChLinkMotor.
                           super_ChLinkMateGeneric.C,(ulong)i);
      pCVar4 = &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask;
      *pSVar2 = aframe12rotating.coord.rot.m_data[3];
      pCVar3 = ChLinkMask::Constr_N(pCVar4,i);
      (*(pCVar3->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                ((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                  *)local_4b0,pCVar3);
      Eigen::
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>::
      setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
               *)local_4b0);
      pCVar3 = ChLinkMask::Constr_N(pCVar4,i);
      (*(pCVar3->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                ((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
                  *)local_4b0,pCVar3);
      Eigen::
      DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>_>::
      setZero((DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>_>
               *)local_4b0);
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_478,&Jw1.super_Matrix<double,_3,_3,_1,_3,_3>,2);
      pCVar3 = ChLinkMask::Constr_N(pCVar4,i);
      (*(pCVar3->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x11])
                (&local_4d0,pCVar3);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_4b0,&local_4d0,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_4b0,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_478)
      ;
      Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true,_true>::
      BlockImpl_dense(&local_478,&Jw2.super_Matrix<double,_3,_3,_1,_3,_3>,2);
      pCVar3 = ChLinkMask::Constr_N(pCVar4,i);
      (*(pCVar3->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint[0x12])
                (&local_4d0,pCVar3);
      Eigen::
      VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_-1>
      ::VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,__1>
                     *)local_4b0,&local_4d0,3,3);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::InnerStride<1>>,1,_1,false>,Eigen::Block<Eigen::Matrix<double,3,3,1,3,3>,1,3,true>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1,__1,_false>
                  *)local_4b0,(Block<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1,_3,_true> *)&local_478)
      ;
    }
  }
  return;
}

Assistant:

void ChLinkMotorRotationSpeed::Update(double mytime, bool update_assets) {
    // Inherit parent class:
    ChLinkMotorRotation::Update(mytime, update_assets);

    // Override the rotational jacobian [Cq] and the rotational residual C,
    // by assuming an additional hidden frame that rotates about frame2:

    if (this->Body1 && this->Body2) {
        ChFrame<> aframe1 = this->frame1 >> (*this->Body1);
        ChFrame<> aframe2 = this->frame2 >> (*this->Body2);

        ChFrame<> aframe12;
        aframe2.TransformParentToLocal(aframe1, aframe12);

        ChFrame<> aframe2rotating;

        double aux_rotation;

        if (this->avoid_angle_drift) {
            aux_rotation = this->aux_dt + this->rot_offset;
        } else {
            // to have it aligned to current rot, to allow C=0.
            aux_rotation = aframe12.GetRot().Q_to_Rotv().z();
        }

        aframe2rotating.SetRot(aframe2.GetRot() * Q_from_AngAxis(aux_rotation, VECT_Z));

        ChFrame<> aframe12rotating;
        aframe2rotating.TransformParentToLocal(aframe1, aframe12rotating);

        ChMatrix33<> abs_plane_rotating = aframe2rotating.GetA();

        ChMatrix33<> Jw1 = abs_plane_rotating.transpose() * Body1->GetA();
        ChMatrix33<> Jw2 = -abs_plane_rotating.transpose() * Body2->GetA();

        // Premultiply by Jw1 and Jw2 by  0.5*[Fp(q_resid)]' to get residual as imaginary part of a quaternion.
        ChStarMatrix33<> mtempM(aframe12rotating.GetRot().GetVector() * 0.5);
        mtempM(0, 0) = 0.5 * aframe12rotating.GetRot().e0();
        mtempM(1, 1) = 0.5 * aframe12rotating.GetRot().e0();
        mtempM(2, 2) = 0.5 * aframe12rotating.GetRot().e0();

        ChMatrix33<> mtempQ;
        mtempQ = mtempM.transpose() * Jw1;
        Jw1 = mtempQ;
        mtempQ = mtempM.transpose() * Jw2;
        Jw2 = mtempQ;

        int nc = 0;

        if (c_x) {
            nc++;
        }
        if (c_y) {
            nc++;
        }
        if (c_z) {
            nc++;
        }
        if (c_rx) {
            C(nc) = aframe12rotating.GetRot().e1();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(0);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(0);
            nc++;
        }
        if (c_ry) {
            C(nc) = aframe12rotating.GetRot().e2();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(1);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(1);
            nc++;
        }
        if (c_rz) {
            C(nc) = aframe12rotating.GetRot().e3();
            mask.Constr_N(nc).Get_Cq_a().setZero();
            mask.Constr_N(nc).Get_Cq_b().setZero();
            mask.Constr_N(nc).Get_Cq_a().segment(3, 3) = Jw1.row(2);
            mask.Constr_N(nc).Get_Cq_b().segment(3, 3) = Jw2.row(2);
            nc++;
        }
    }
}